

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<QtPromise::QPromise<int>>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>,tst_qpromise_finally::rejectedAsyncResolve()::__1>
               (QPromiseResolve<int> *resolve,QPromiseReject<int> *reject,anon_class_8_1_70098e60 fn
               )

{
  QPromise<int> local_30;
  QPromiseReject<int> *local_20;
  QPromiseReject<int> *reject_local;
  QPromiseResolve<int> *resolve_local;
  anon_class_8_1_70098e60 fn_local;
  
  local_20 = reject;
  reject_local = (QPromiseReject<int> *)resolve;
  resolve_local = (QPromiseResolve<int> *)fn.values;
  tst_qpromise_finally::rejectedAsyncResolve::anon_class_8_1_70098e60::operator()
            ((anon_class_8_1_70098e60 *)&local_30);
  PromiseFulfill<QtPromise::QPromise<int>>::
  call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_30,(QPromiseResolve<int> *)reject_local,local_20);
  QtPromise::QPromise<int>::~QPromise(&local_30);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }